

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  pointer pMVar1;
  size_t in_length;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer pMVar6;
  uint local_138;
  shared_ptr<httplib::detail::mmap> mm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  __shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2> local_c8;
  _Any_data local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string local_90;
  string sub_path;
  ContentProvider local_50;
  
  pMVar1 = (this->base_dirs_).
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_138 = (uint)&this->file_request_handler_;
  for (pMVar6 = (this->base_dirs_).
                super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar1; pMVar6 = pMVar6 + 1) {
    iVar4 = std::__cxx11::string::compare
                      ((ulong)&req->path,0,(string *)(pMVar6->mount_point)._M_string_length);
    if (iVar4 == 0) {
      std::__cxx11::string::substr((ulong)&path,(ulong)&req->path);
      std::operator+(&sub_path,"/",&path);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = detail::is_valid_path(&sub_path);
      bVar3 = true;
      if (bVar2) {
        std::operator+(&path,&pMVar6->base_dir,&sub_path);
        if (path._M_dataplus._M_p[path._M_string_length - 1] == '/') {
          std::__cxx11::string::append((char *)&path);
        }
        bVar3 = detail::is_file(&path);
        if (bVar3) {
          for (p_Var5 = (pMVar6->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != &(pMVar6->headers)._M_t._M_impl.super__Rb_tree_header;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,*(char **)(p_Var5 + 1),(allocator<char> *)&mm);
            Response::set_header(res,&local_90,(string *)(p_Var5 + 2));
            std::__cxx11::string::~string((string *)&local_90);
          }
          local_90._M_dataplus._M_p = path._M_dataplus._M_p;
          std::make_shared<httplib::detail::mmap,char_const*>((char **)&mm);
          bVar2 = (mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->addr_ != (void *)0x0;
          local_138 = (uint)bVar2;
          if (bVar2) {
            in_length = (mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->size_;
            detail::find_content_type
                      (&local_90,&path,&this->file_extension_and_mimetype_map_,
                       &this->default_file_mimetype_);
            std::__shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_c8,
                       &mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>);
            std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::
            function<httplib::Server::handle_file_request(httplib::Request_const&,httplib::Response&,bool)::_lambda(unsigned_long,unsigned_long,httplib::DataSink&)_1_,void>
                      ((function<bool(unsigned_long,unsigned_long,httplib::DataSink&)> *)&local_50,
                       (anon_class_16_1_3fcf665e *)&local_c8);
            local_a8 = 0;
            uStack_a0 = 0;
            local_b8._M_unused._M_object = (void *)0x0;
            local_b8._8_8_ = 0;
            Response::set_content_provider
                      (res,in_length,&local_90,&local_50,
                       (ContentProviderResourceReleaser *)&local_b8);
            std::_Function_base::~_Function_base((_Function_base *)&local_b8);
            std::_Function_base::~_Function_base(&local_50.super__Function_base);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
            std::__cxx11::string::~string((string *)&local_90);
            if ((!head) &&
               ((this->file_request_handler_).super__Function_base._M_manager != (_Manager_type)0x0)
               ) {
              std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                        (&this->file_request_handler_,req,res);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&path);
        bVar3 = !bVar3;
      }
      std::__cxx11::string::~string((string *)&sub_path);
      if (!bVar3) goto LAB_00141bdb;
    }
  }
  local_138._0_1_ = 0;
LAB_00141bdb:
  return (bool)((byte)local_138 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        if (detail::is_file(path)) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first.c_str(), kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}